

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_7;
  ostringstream error_message_6;
  DataDumpWrapper data_dump;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  ostringstream error_message_3;
  string str;
  char *arg;
  int i;
  char *input_file;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  string data_type;
  string print_format;
  int maximum_index;
  int minimum_index;
  option *in_stack_ffffffffffffee98;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffeea0;
  undefined1 in_stack_ffffffffffffeea7;
  string *in_stack_ffffffffffffeea8;
  undefined4 in_stack_ffffffffffffeeb0;
  int in_stack_ffffffffffffeeb4;
  char *local_1148;
  bool local_10ba;
  bool local_109a;
  string *in_stack_ffffffffffffefa0;
  string *in_stack_ffffffffffffefa8;
  DataDumpWrapper *in_stack_ffffffffffffefb0;
  ostringstream local_1038 [192];
  ostringstream *in_stack_fffffffffffff088;
  string *in_stack_fffffffffffff090;
  allocator local_eb9;
  string local_eb8 [32];
  ostringstream local_e98 [8];
  ostream *in_stack_fffffffffffff170;
  DataDumpWrapper local_d20;
  char *local_d18;
  allocator local_d09;
  string local_d08 [32];
  ostringstream local_ce8 [376];
  char local_b70 [527];
  allocator local_961;
  string local_960 [32];
  ostringstream local_940 [383];
  allocator local_7c1;
  string local_7c0 [32];
  ostringstream local_7a0 [376];
  string local_628 [39];
  allocator local_601;
  string local_600 [32];
  char *local_5e0;
  int local_5d4;
  char *local_5d0;
  allocator local_5c1;
  string local_5c0 [32];
  ostringstream local_5a0 [376];
  string local_428 [39];
  allocator local_401;
  string local_400 [32];
  ostringstream local_3e0 [383];
  allocator local_261;
  string local_260 [32];
  undefined4 local_240;
  allocator local_239;
  string local_238 [32];
  ostringstream local_218 [383];
  allocator local_99;
  string local_98 [32];
  int local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  int local_18;
  undefined4 local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = -1;
  paVar6 = &local_39;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",paVar6);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = (anonymous_namespace)::kDefaultDataType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
LAB_00103757:
  local_78 = ya_getopt_long(in_stack_ffffffffffffeeb4,(char **)in_stack_ffffffffffffeea8,
                            (char *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                            in_stack_ffffffffffffee98,(int *)0x10377a);
  pcVar1 = ya_optarg;
  if (local_78 == -1) {
    local_5d0 = (char *)0x0;
    local_5d4 = local_8 - ya_optind;
    goto LAB_00103f22;
  }
  switch(local_78) {
  case 0x66:
    goto switchD_0010383c_caseD_66;
  default:
    anon_unknown.dwarf_ba9::PrintUsage(in_stack_fffffffffffff170);
    local_4 = 1;
    local_240 = 1;
    goto LAB_00104808;
  case 0x68:
    anon_unknown.dwarf_ba9::PrintUsage(in_stack_fffffffffffff170);
    local_4 = 0;
    local_240 = 1;
    goto LAB_00104808;
  case 0x6c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    bVar2 = sptk::ConvertStringToInteger
                      (in_stack_ffffffffffffeea8,
                       (int *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0));
    local_109a = !bVar2 || local_18 < 1;
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    if (local_109a) {
      std::__cxx11::ostringstream::ostringstream(local_218);
      std::operator<<((ostream *)local_218,
                      "The argument for the -l option must be a positive integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"dmp",&local_239);
      sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      local_4 = 1;
      local_240 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_218);
      goto LAB_00104808;
    }
    local_14 = 1;
    goto LAB_00103757;
  case 0x6d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,pcVar1,&local_261);
    bVar2 = sptk::ConvertStringToInteger
                      (in_stack_ffffffffffffeea8,
                       (int *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0));
    local_10ba = !bVar2 || local_18 < 0;
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    if (local_10ba) {
      std::__cxx11::ostringstream::ostringstream(local_3e0);
      poVar5 = std::operator<<((ostream *)local_3e0,"The argument for the -m option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,"dmp",&local_401);
      sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      local_4 = 1;
      local_240 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_3e0);
      goto LAB_00104808;
    }
    local_14 = 0;
    goto LAB_00103757;
  }
LAB_00103f22:
  if (local_5d4 < 1) goto LAB_001041b8;
  local_5e0 = *(char **)(local_10 + (long)(local_8 - local_5d4) * 8);
  iVar4 = strncmp(local_5e0,"+",1);
  pcVar1 = local_5e0;
  if (iVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_600,pcVar1,&local_601);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    std::__cxx11::string::substr((ulong)local_628,(ulong)local_600);
    std::__cxx11::string::operator=(local_70,local_628);
    std::__cxx11::string::~string(local_628);
    std::__cxx11::string::~string(local_600);
  }
  else {
    if (local_5d0 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_7a0);
      std::operator<<((ostream *)local_7a0,"Too many input files");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c0,"dmp",&local_7c1);
      sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
      std::__cxx11::string::~string(local_7c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
      local_4 = 1;
      local_240 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_7a0);
      goto LAB_00104808;
    }
    local_5d0 = local_5e0;
  }
  local_5d4 = local_5d4 + -1;
  goto LAB_00103f22;
switchD_0010383c_caseD_66:
  std::__cxx11::string::operator=(local_38,ya_optarg);
  std::__cxx11::string::substr((ulong)local_428,(ulong)local_38);
  bVar2 = std::operator!=((char *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffee98);
  std::__cxx11::string::~string(local_428);
  if (bVar2) goto LAB_00103d45;
  goto LAB_00103757;
LAB_00103d45:
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  poVar5 = std::operator<<((ostream *)local_5a0,"The argument for the -f option must be begin with "
                          );
  std::operator<<(poVar5,"%");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"dmp",&local_5c1);
  sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  local_4 = 1;
  local_240 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  goto LAB_00104808;
LAB_001041b8:
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_940);
    std::operator<<((ostream *)local_940,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_960,"dmp",&local_961);
    sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
    std::__cxx11::string::~string(local_960);
    std::allocator<char>::~allocator((allocator<char> *)&local_961);
    local_4 = 1;
    local_240 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_940);
    goto LAB_00104808;
  }
  std::ifstream::ifstream(local_b70);
  pcVar1 = local_5d0;
  if (local_5d0 == (char *)0x0) {
LAB_001044b8:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      local_1148 = (char *)&std::cin;
    }
    else {
      local_1148 = local_b70;
    }
    local_d18 = local_1148;
    anon_unknown.dwarf_ba9::DataDumpWrapper::DataDumpWrapper
              (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
               (int)((ulong)paVar6 >> 0x20),(int)paVar6);
    bVar2 = anon_unknown.dwarf_ba9::DataDumpWrapper::IsValid(&local_d20);
    if (bVar2) {
      in_stack_ffffffffffffeea7 =
           anon_unknown.dwarf_ba9::DataDumpWrapper::Run
                     ((DataDumpWrapper *)
                      CONCAT44(CONCAT13(bVar2,(int3)in_stack_ffffffffffffeeb4),
                               in_stack_ffffffffffffeeb0),(istream *)in_stack_ffffffffffffeea8);
      if ((bool)in_stack_ffffffffffffeea7) {
        local_4 = 0;
        local_240 = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1038);
        std::operator<<((ostream *)local_1038,"Failed to dump");
        paVar6 = (allocator *)&stack0xffffffffffffefa7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xffffffffffffefa8,"dmp",paVar6);
        sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffefa8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffefa7);
        local_4 = 1;
        local_240 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1038);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_e98);
      std::operator<<((ostream *)local_e98,"Unexpected argument for the +type option");
      paVar6 = &local_eb9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_eb8,"dmp",paVar6);
      sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
      std::__cxx11::string::~string(local_eb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
      local_4 = 1;
      local_240 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e98);
    }
    anon_unknown.dwarf_ba9::DataDumpWrapper::~DataDumpWrapper
              ((DataDumpWrapper *)CONCAT17(in_stack_ffffffffffffeea7,in_stack_ffffffffffffeea0));
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_b70,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_001044b8;
    std::__cxx11::ostringstream::ostringstream(local_ce8);
    poVar5 = std::operator<<((ostream *)local_ce8,"Cannot open file ");
    std::operator<<(poVar5,local_5d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d08,"dmp",&local_d09);
    sptk::PrintErrorMessage(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
    std::__cxx11::string::~string(local_d08);
    std::allocator<char>::~allocator((allocator<char> *)&local_d09);
    local_4 = 1;
    local_240 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ce8);
  }
  std::ifstream::~ifstream(local_b70);
LAB_00104808:
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int minimum_index(0);
  int maximum_index(kMagicNumberForEndOfFile);
  std::string print_format("");
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 1;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 0;
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be begin with "
                        << "%";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  DataDumpWrapper data_dump(data_type, print_format, minimum_index,
                            maximum_index);

  if (!data_dump.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  if (!data_dump.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to dump";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  return 0;
}